

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

void __thiscall
cmFileCommand::AddEvaluationFile
          (cmFileCommand *this,string *inputName,string *outputExpr,string *condition,
          bool inputIsContent)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  cmMakefile *this_01;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  local_b0;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  local_a8;
  undefined1 local_a0 [8];
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  conditionCge;
  undefined1 local_88 [8];
  cmGeneratorExpression conditionGe;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  outputCge;
  cmListFileBacktrace local_60;
  undefined1 local_50 [8];
  cmGeneratorExpression outputGe;
  cmListFileBacktrace lfbt;
  bool inputIsContent_local;
  string *condition_local;
  string *outputExpr_local;
  string *inputName_local;
  cmFileCommand *this_local;
  
  this_00 = &outputGe.Backtrace.TopEntry.
             super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount;
  cmMakefile::GetBacktrace((cmMakefile *)this_00);
  cmListFileBacktrace::cmListFileBacktrace(&local_60,(cmListFileBacktrace *)this_00);
  cmGeneratorExpression::cmGeneratorExpression((cmGeneratorExpression *)local_50,&local_60);
  cmListFileBacktrace::~cmListFileBacktrace(&local_60);
  cmGeneratorExpression::Parse
            ((cmGeneratorExpression *)
             &conditionGe.Backtrace.TopEntry.
              super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(string *)local_50);
  cmListFileBacktrace::cmListFileBacktrace
            ((cmListFileBacktrace *)&conditionCge,
             (cmListFileBacktrace *)
             &outputGe.Backtrace.TopEntry.
              super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  cmGeneratorExpression::cmGeneratorExpression
            ((cmGeneratorExpression *)local_88,(cmListFileBacktrace *)&conditionCge);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&conditionCge);
  cmGeneratorExpression::Parse((cmGeneratorExpression *)local_a0,(string *)local_88);
  this_01 = (this->super_cmCommand).Makefile;
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  unique_ptr(&local_a8,
             (unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
              *)&conditionGe.Backtrace.TopEntry.
                 super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount);
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  unique_ptr(&local_b0,
             (unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
              *)local_a0);
  cmMakefile::AddEvaluationFile(this_01,inputName,&local_a8,&local_b0,inputIsContent);
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  ~unique_ptr(&local_b0);
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  ~unique_ptr(&local_a8);
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               *)local_a0);
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_88);
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               *)&conditionGe.Backtrace.TopEntry.
                  super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_50);
  cmListFileBacktrace::~cmListFileBacktrace
            ((cmListFileBacktrace *)
             &outputGe.Backtrace.TopEntry.
              super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void cmFileCommand::AddEvaluationFile(const std::string& inputName,
                                      const std::string& outputExpr,
                                      const std::string& condition,
                                      bool inputIsContent)
{
  cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();

  cmGeneratorExpression outputGe(lfbt);
  std::unique_ptr<cmCompiledGeneratorExpression> outputCge =
    outputGe.Parse(outputExpr);

  cmGeneratorExpression conditionGe(lfbt);
  std::unique_ptr<cmCompiledGeneratorExpression> conditionCge =
    conditionGe.Parse(condition);

  this->Makefile->AddEvaluationFile(inputName, std::move(outputCge),
                                    std::move(conditionCge), inputIsContent);
}